

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

boolean create_particular(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  boolean local_141;
  boolean makehostile;
  boolean makepeaceful;
  boolean maketame;
  monst *pmStack_140;
  boolean madeany;
  monst *mtmp;
  permonst *whichpm;
  int i;
  int tries;
  int which;
  char monclass;
  char *bufp;
  char buf [256];
  
  tries._3_1_ = '=';
  local_141 = '\0';
  whichpm._4_4_ = 0;
  do {
    i = (int)urole.malenum;
    bVar5 = false;
    bVar2 = false;
    bVar1 = false;
    getlin("Create what kind of monster? [type the name or symbol]",(char *)&bufp);
    _which = mungspaces((char *)&bufp);
    if (*_which == '\x1b') {
      return '\0';
    }
    iVar3 = strncasecmp(_which,"tame ",5);
    if (iVar3 == 0) {
      _which = _which + 5;
      bVar1 = true;
    }
    else {
      iVar3 = strncasecmp(_which,"peaceful ",9);
      if (iVar3 == 0) {
        _which = _which + 9;
        bVar2 = true;
      }
      else {
        iVar3 = strncasecmp(_which,"hostile ",8);
        bVar5 = iVar3 == 0;
        if (bVar5) {
          _which = _which + 8;
        }
      }
    }
    sVar4 = strlen(_which);
    if (sVar4 == 1) {
      iVar3 = def_char_to_monclass(*_which);
      tries._3_1_ = (char)iVar3;
      if (tries._3_1_ != '=') break;
    }
    else {
      i = name_to_mon(_which);
      if (-1 < i) break;
    }
    pline("I\'ve never heard of such monsters.");
    whichpm._4_4_ = whichpm._4_4_ + 1;
  } while (whichpm._4_4_ < 5);
  if (whichpm._4_4_ == 5) {
    pline("That\'s enough tries!");
  }
  else {
    cant_create(&i,'\0');
    mtmp = (monst *)(mons + i);
    for (whichpm._0_4_ = 0; (int)whichpm <= multi; whichpm._0_4_ = (int)whichpm + 1) {
      if (tries._3_1_ != '=') {
        mtmp = (monst *)mkclass(&u.uz,tries._3_1_,0);
      }
      if (bVar1) {
        pmStack_140 = makemon((permonst *)mtmp,level,(int)u.ux,(int)u.uy,4);
        if (pmStack_140 != (monst *)0x0) {
          initedog(pmStack_140);
          set_malign(pmStack_140);
        }
      }
      else {
        pmStack_140 = makemon((permonst *)mtmp,level,(int)u.ux,(int)u.uy,0);
        if (((bVar2) || (bVar5)) && (pmStack_140 != (monst *)0x0)) {
          pmStack_140->mtame = '\0';
          *(uint *)&pmStack_140->field_0x60 =
               *(uint *)&pmStack_140->field_0x60 & 0xffbfffff | (uint)bVar2 << 0x16;
          set_malign(pmStack_140);
        }
      }
      if (pmStack_140 != (monst *)0x0) {
        local_141 = '\x01';
      }
    }
  }
  return local_141;
}

Assistant:

boolean create_particular(void)
{
	char buf[BUFSZ], *bufp, monclass = MAXMCLASSES;
	int which, tries, i;
	const struct permonst *whichpm;
	struct monst *mtmp;
	boolean madeany = FALSE;
	boolean maketame, makepeaceful, makehostile;

	tries = 0;
	do {
	    which = urole.malenum;	/* an arbitrary index into mons[] */
	    maketame = makepeaceful = makehostile = FALSE;
	    getlin("Create what kind of monster? [type the name or symbol]",
		   buf);
	    bufp = mungspaces(buf);
	    if (*bufp == '\033') return FALSE;
	    /* allow the initial disposition to be specified */
	    if (!strncmpi(bufp, "tame ", 5)) {
		bufp += 5;
		maketame = TRUE;
	    } else if (!strncmpi(bufp, "peaceful ", 9)) {
		bufp += 9;
		makepeaceful = TRUE;
	    } else if (!strncmpi(bufp, "hostile ", 8)) {
		bufp += 8;
		makehostile = TRUE;
	    }
	    /* decide whether a valid monster was chosen */
	    if (strlen(bufp) == 1) {
		monclass = def_char_to_monclass(*bufp);
		if (monclass != MAXMCLASSES) break;	/* got one */
	    } else {
		which = name_to_mon(bufp);
		if (which >= LOW_PM) break;		/* got one */
	    }
	    /* no good; try again... */
	    pline("I've never heard of such monsters.");
	} while (++tries < 5);

	if (tries == 5) {
	    pline("That's enough tries!");
	} else {
	    cant_create(&which, FALSE);
	    whichpm = &mons[which];
	    for (i = 0; i <= multi; i++) {
		if (monclass != MAXMCLASSES)
		    whichpm = mkclass(&u.uz, monclass, 0);
		if (maketame) {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, MM_EDOG);
		    if (mtmp) {
			initedog(mtmp);
			set_malign(mtmp);
		    }
		} else {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, NO_MM_FLAGS);
		    if ((makepeaceful || makehostile) && mtmp) {
			mtmp->mtame = 0;	/* sanity precaution */
			mtmp->mpeaceful = makepeaceful ? 1 : 0;
			set_malign(mtmp);
		    }
		}
		if (mtmp) madeany = TRUE;
	    }
	}
	return madeany;
}